

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O3

void __thiscall
nestl::has_exceptions::vector<int,_nestl::allocator<int>_>::vector
          (vector<int,_nestl::allocator<int>_> *this,vector<int,_nestl::allocator<int>_> *other)

{
  pointer piVar1;
  pointer piVar2;
  undefined8 uVar3;
  default_operation_error err;
  long local_28;
  long local_20;
  long local_18;
  
  (this->super_vector<int,_nestl::allocator<int>_>).m_start = (pointer)0x0;
  (this->super_vector<int,_nestl::allocator<int>_>).m_finish = (pointer)0x0;
  (this->super_vector<int,_nestl::allocator<int>_>).m_end_of_storage = (pointer)0x0;
  local_18 = 0;
  piVar1 = (other->super_vector<int,_nestl::allocator<int>_>).m_start;
  piVar2 = (other->super_vector<int,_nestl::allocator<int>_>).m_finish;
  (this->super_vector<int,_nestl::allocator<int>_>).m_end_of_storage = (pointer)0x0;
  (this->super_vector<int,_nestl::allocator<int>_>).m_start = (pointer)0x0;
  (this->super_vector<int,_nestl::allocator<int>_>).m_finish = (pointer)0x0;
  impl::vector<int,nestl::allocator<int>>::
  assign_iterator<nestl::has_exceptions::exception_ptr_error,int_const*>
            ((vector<int,nestl::allocator<int>> *)this,&local_18,piVar1,piVar2);
  operator_delete((void *)0x0);
  if (local_18 == 0) {
    return;
  }
  local_20 = local_18;
  std::__exception_ptr::exception_ptr::_M_addref();
  local_28 = local_20;
  if (local_20 != 0) {
    std::__exception_ptr::exception_ptr::_M_addref();
  }
  uVar3 = std::rethrow_exception((exception_ptr)&local_28);
  if (local_28 != 0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  has_exceptions::vector();
  operator_delete((this->super_vector<int,_nestl::allocator<int>_>).m_start);
  _Unwind_Resume(uVar3);
}

Assistant:

vector<T, A>::vector(const vector& other)
    : base_t(other.get_allocator())
{
    default_operation_error err;
    this->copy_nothrow(err, other);
    if (err)
    {
        throw_exception(err);
    }
}